

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void CVmPack::parse_mods(CVmPackPos *p,CVmPackType *t)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  int __c;
  int __c_00;
  int __c_01;
  uint uVar4;
  CVmPackPos *in_RSI;
  CVmPackPos *in_RDI;
  int minval;
  int count_idx;
  wchar_t c;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  uint in_stack_ffffffffffffffe8;
  CVmPackPos *this;
  
  this = in_RSI;
LAB_003273ee:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              iVar1 = CVmPackPos::more((CVmPackPos *)
                                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                                      );
              if (iVar1 == 0) {
                return;
              }
              wVar2 = CVmPackPos::getch((CVmPackPos *)
                                        CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0
                                                ));
              if (wVar2 != L'<') break;
              *(undefined4 *)&this[1].len = 0;
              CVmPackPos::inc((CVmPackPos *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
            }
            if (wVar2 != L'>') break;
            *(undefined4 *)&this[1].len = 1;
            CVmPackPos::inc((CVmPackPos *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
          }
          if (wVar2 != L'0') break;
          uVar4 = (uint)(char)*(undefined4 *)&(this->p).p_;
          in_RSI = (CVmPackPos *)(ulong)uVar4;
          pcVar3 = strchr("auwhH",uVar4);
          if (pcVar3 == (char *)0x0) {
            pcVar3 = CVmPackPos::index(in_RDI,(char *)in_RSI,__c);
            err_throw_a(0x6b,1,0,(ulong)pcVar3 & 0xffffffff);
          }
          *(undefined4 *)&this[2].field_0x14 = 1;
          CVmPackPos::inc((CVmPackPos *)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        }
        iVar1 = is_digit(L'\0');
        if (iVar1 == 0) break;
        if (*(int *)((long)&this[1].len + 4) == -2) {
          *(undefined4 *)&this[2].p.p_ = 1;
        }
        pcVar3 = CVmPackPos::index(in_RDI,(char *)in_RSI,__c_00);
        in_stack_ffffffffffffffe8 = (uint)pcVar3;
        iVar1 = CVmPackPos::parse_int(this);
        *(int *)((long)&this[1].len + 4) = iVar1;
        *(undefined4 *)&this[1].field_0x14 = 0;
        in_stack_ffffffffffffffe4 = (uint)(*(int *)&(this->p).p_ != 0x40);
        if (*(int *)((long)&this[1].len + 4) < (int)in_stack_ffffffffffffffe4) {
          err_throw_a(0x6b,1,0,(ulong)in_stack_ffffffffffffffe8);
        }
      }
      if (wVar2 != L':') break;
      CVmPackPos::inc((CVmPackPos *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      wVar2 = CVmPackPos::nextch((CVmPackPos *)CONCAT44(wVar2,in_stack_ffffffffffffffe8));
      switch(wVar2) {
      case L'A':
      case L'H':
      case L'U':
      case L'a':
      case L'b':
      case L'h':
      case L'k':
      case L'u':
        *(wchar_t *)&this[1].field_0x14 = wVar2;
        *(undefined4 *)((long)&this[1].len + 4) = 1;
      case L'W':
      case L'w':
        *(wchar_t *)&this[1].field_0x14 = wVar2;
        *(undefined4 *)((long)&this[1].len + 4) = 2;
        break;
      default:
        pcVar3 = CVmPackPos::index(in_RDI,(char *)in_RSI,__c_01);
        err_throw_a(0x6b,1,0,(ulong)pcVar3 & 0xffffffff);
      case L'C':
      case L'c':
        *(wchar_t *)&this[1].field_0x14 = wVar2;
        *(undefined4 *)((long)&this[1].len + 4) = 1;
        break;
      case L'L':
      case L'f':
      case L'l':
        *(wchar_t *)&this[1].field_0x14 = wVar2;
        *(undefined4 *)((long)&this[1].len + 4) = 4;
        break;
      case L'Q':
      case L'd':
      case L'q':
        *(wchar_t *)&this[1].field_0x14 = wVar2;
        *(undefined4 *)((long)&this[1].len + 4) = 8;
        break;
      case L'S':
      case L's':
        *(wchar_t *)&this[1].field_0x14 = wVar2;
        *(undefined4 *)((long)&this[1].len + 4) = 2;
      }
    }
    if (wVar2 == L'*') {
      if (*(int *)((long)&this[1].len + 4) < 0) {
        iVar1 = star_to_count(*(wchar_t *)&(this->p).p_);
        *(int *)((long)&this[1].len + 4) = iVar1;
        *(undefined4 *)&this[1].field_0x14 = 0;
      }
      else {
        *(undefined4 *)&this[2].p.p_ = 1;
      }
      CVmPackPos::inc((CVmPackPos *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      goto LAB_003273ee;
    }
    if (wVar2 == L'!') {
      if (*(int *)&(this->p).p_ == 0) {
LAB_003276e3:
        pcVar3 = (char *)((long)&this[2].p.p_ + 4);
        pcVar3[0] = '\x01';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
      }
      else {
        uVar4 = (uint)(char)*(undefined4 *)&(this->p).p_;
        in_RSI = (CVmPackPos *)(ulong)uVar4;
        pcVar3 = strchr("wWhH",uVar4);
        if (pcVar3 == (char *)0x0) goto LAB_003276e3;
        this[1].idx = 1;
      }
      CVmPackPos::inc((CVmPackPos *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
    else if (wVar2 == L'~') {
      *(undefined4 *)&this[2].len = 1;
      CVmPackPos::inc((CVmPackPos *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
    else if (wVar2 == L'?') {
      this[2].idx = 1;
      CVmPackPos::inc((CVmPackPos *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
    else {
      if (wVar2 != L'%') {
        return;
      }
      *(undefined4 *)((long)&this[2].len + 4) = 1;
      CVmPackPos::inc((CVmPackPos *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
  } while( true );
}

Assistant:

void CVmPack::parse_mods(CVmPackPos *p, CVmPackType *t)
{
    /* keep going until we stop finding modifiers */
    while (p->more())
    {
        /* get the next character */
        wchar_t c = p->getch();

        /* check what we have */
        if (c == '<')
        {
            /* little-endian flag - note it and skip it */
            t->big_endian = FALSE;
            p->inc();
        }
        else if (c == '>')
        {
            /* big-endian flag - note it and skip it */
            t->big_endian = TRUE;
            p->inc();
        }
        else if (c == '0')
        {
            /* this can only be used with certain string types */
            if (strchr("auwhH", (char)t->type_code) == 0)
                err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p->index());

            /* null-termination */
            t->null_term = TRUE;
            p->inc();
        }
        else if (is_digit(c))
        {
            /* 
             *   if we already have a '*', the combination of a numeric count
             *   and a '*' makes it an up-to count 
             */
            if (t->count == ITER_STAR)
                t->up_to_count = TRUE;

            /* it's a digit, so this is a simple numeric repeat count */
            int count_idx = p->index();
            t->count = p->parse_int();
            t->count_as_type = 0;

            /* enforce a minimum value of 1 for most types, 0 for @ */
            int minval = (t->type_code == '@' ? 0 : 1);
            if (t->count < minval)
                err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, count_idx);
        }
        else if (c == ':')
        {
            /* repeat count as type - get and remember the type code */
            p->inc();
            c = p->nextch();

            /* validate the type code and get its size */
            switch (c)
            {
            case 'a':
            case 'A':
            case 'b':
            case 'u':
            case 'U':
            case 'h':
            case 'H':
            case 'k':
                t->count_as_type = c;
                t->count = 1;

            case 'w':
            case 'W':
                t->count_as_type = c;
                t->count = 2;
                break;
                
            case 'c':
            case 'C':
                t->count_as_type = c;
                t->count = 1;
                break;
                
            case 's':
            case 'S':
                t->count_as_type = c;
                t->count = 2;
                break;
                
            case 'l':
            case 'L':
            case 'f':
                t->count_as_type = c;
                t->count = 4;
                break;
                
            case 'q':
            case 'Q':
            case 'd':
                t->count_as_type = c;
                t->count = 8;
                break;

            default:
                /* invalid type */
                err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p->index());
            }
        }
        else if (c == '*')
        {
            /* 
             *   if we already have a numeric count, this makes it an up-to
             *   count 
             */
            if (t->count >= 0)
            {
                /* mark it as an up-to count, but leave the count intact */
                t->up_to_count = TRUE;
            }
            else
            {
                /* there's no count yet, so it's an indefinite counter type */
                t->count = star_to_count(t->type_code);
                t->count_as_type = 0;
            }

            /* skip the '*' */
            p->inc();
        }
        else if (c == '!')
        {
            /* 
             *   ! means "count in bytes" for string types wWhH; for other
             *   types just record the !
             */
            if (t->type_code != 0 && strchr("wWhH", (char)t->type_code) != 0)
                t->count_in_bytes = TRUE;
            else
                t->bang = TRUE;
            p->inc();
        }
        else if (c == '~')
        {
            /* note the ~ qualifier */
            t->tilde = TRUE;
            p->inc();
        }
        else if (c == '?')
        {
            /* note the ? qualifier */
            t->qu = TRUE;
            p->inc();
        }
        else if (c == '%')
        {
            /* note the % qualifier */
            t->pct = TRUE;
            p->inc();
        }
        else
        {
            /* it's not a modifier character, so we're done */
            break;
        }
    }
}